

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_status.cpp
# Opt level: O3

torrent_status * __thiscall
libtorrent::torrent_status::operator=(torrent_status *this,torrent_status *param_1)

{
  _Head_base<0UL,_unsigned_int_*,_false> _Var1;
  error_category *peVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  int *piVar8;
  bool bVar9;
  undefined3 uVar10;
  uint bits;
  uint bits_00;
  
  (this->handle).m_torrent.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (param_1->handle).m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->handle).m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(param_1->handle).m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar9 = (param_1->errc).failed_;
  uVar10 = *(undefined3 *)&(param_1->errc).field_0x5;
  peVar2 = (param_1->errc).cat_;
  (this->errc).val_ = (param_1->errc).val_;
  (this->errc).failed_ = bVar9;
  *(undefined3 *)&(this->errc).field_0x5 = uVar10;
  (this->errc).cat_ = peVar2;
  (this->error_file).m_val = (param_1->error_file).m_val;
  ::std::__cxx11::string::_M_assign((string *)&this->save_path);
  ::std::__cxx11::string::_M_assign((string *)&this->name);
  (this->torrent_file).super___weak_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (param_1->torrent_file).
           super___weak_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->torrent_file).
              super___weak_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(param_1->torrent_file).
              super___weak_ptr<const_libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  (this->next_announce).__r = (param_1->next_announce).__r;
  ::std::__cxx11::string::_M_assign((string *)&this->current_tracker);
  iVar3 = param_1->total_download;
  iVar4 = param_1->total_upload;
  iVar5 = param_1->total_payload_download;
  iVar6 = param_1->total_payload_upload;
  iVar7 = param_1->total_redundant_bytes;
  this->total_failed_bytes = param_1->total_failed_bytes;
  this->total_redundant_bytes = iVar7;
  this->total_payload_download = iVar5;
  this->total_payload_upload = iVar6;
  this->total_download = iVar3;
  this->total_upload = iVar4;
  if (param_1 != this) {
    _Var1._M_head_impl =
         *(uint **)&(param_1->pieces).super_bitfield.m_buf.
                    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
    piVar8 = (int *)(_Var1._M_head_impl + 1);
    bits_00 = 0;
    bits = 0;
    if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var1._M_head_impl ==
        (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
      piVar8 = (int *)0x0;
    }
    else {
      bits = *_Var1._M_head_impl;
    }
    bitfield::assign(&(this->pieces).super_bitfield,(char *)piVar8,bits);
    _Var1._M_head_impl =
         *(uint **)&(param_1->verified_pieces).super_bitfield.m_buf.
                    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
    piVar8 = (int *)(_Var1._M_head_impl + 1);
    if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var1._M_head_impl ==
        (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
      piVar8 = (int *)0x0;
    }
    else {
      bits_00 = *_Var1._M_head_impl;
    }
    bitfield::assign(&(this->verified_pieces).super_bitfield,(char *)piVar8,bits_00);
  }
  memcpy(&this->total_done,&param_1->total_done,0x140);
  return this;
}

Assistant:

torrent_status::torrent_status(torrent_status const&) = default;